

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::EnumValueOptions::_InternalParse
          (EnumValueOptions *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  Rep *pRVar5;
  UninterpretedOption *msg;
  uint uVar6;
  ulong uVar7;
  uint32 res;
  uint tag;
  uint uVar8;
  int iVar9;
  pair<const_char_*,_unsigned_int> pVar10;
  pair<const_char_*,_unsigned_long> pVar11;
  pair<const_char_*,_bool> pVar12;
  
  uVar8 = 0;
LAB_0017446b:
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) goto LAB_00174658;
      pVar12 = internal::EpsCopyInputStream::DoneFallback
                         (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      ptr = pVar12.first;
      if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_00174658;
    }
    bVar1 = *ptr;
    pVar10.second._0_1_ = bVar1;
    pVar10.first = (char *)((byte *)ptr + 1);
    pVar10._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar10 = internal::ReadTagFallback(ptr,res);
        if (pVar10.first == (char *)0x0) goto LAB_0017466b;
      }
      else {
        pVar10.second = res;
        pVar10.first = (char *)((byte *)ptr + 2);
        pVar10._12_4_ = 0;
      }
    }
    ptr = pVar10.first;
    tag = pVar10.second;
    uVar6 = (uint)(pVar10._8_8_ >> 3) & 0x1fffffff;
    if (uVar6 == 999) {
      if ((char)pVar10.second == ':') {
        ptr = (char *)((byte *)ptr + -2);
        do {
          pRVar5 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar5 == (Rep *)0x0) {
            iVar9 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_;
LAB_00174527:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,iVar9 + 1);
            pRVar5 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            iVar9 = pRVar5->allocated_size;
LAB_00174537:
            pRVar5->allocated_size = iVar9 + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>
                            ((this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_);
            pRVar5 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            iVar9 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar9 + 1;
            pRVar5->elements[iVar9] = msg;
          }
          else {
            iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            iVar9 = pRVar5->allocated_size;
            if (iVar9 <= iVar3) {
              if (iVar9 == (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_00174527;
              goto LAB_00174537;
            }
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg = (UninterpretedOption *)pRVar5->elements[iVar3];
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                          (ctx,msg,(char *)((byte *)ptr + 2));
          if ((byte *)ptr == (byte *)0x0) goto LAB_0017466b;
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*(short *)ptr == 0x3eba));
        goto LAB_0017446b;
      }
LAB_001745b1:
      if ((tag == 0) || ((tag & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        goto LAB_00174658;
      }
      if (tag < 8000) {
        ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr,ctx);
      }
      else {
        ptr = internal::ExtensionSet::ParseField
                        (&this->_extensions_,pVar10._8_8_ & 0xffffffff,ptr,
                         (Message *)_EnumValueOptions_default_instance_,&this->_internal_metadata_,
                         ctx);
      }
    }
    else {
      if ((uVar6 != 1) || ((char)pVar10.second != '\b')) goto LAB_001745b1;
      uVar7 = (ulong)*ptr;
      pbVar4 = (byte *)ptr + 1;
      if (-1 < (long)uVar7) {
LAB_001744fb:
        ptr = (char *)pbVar4;
        this->deprecated_ = uVar7 != 0;
        uVar8 = 1;
        goto LAB_0017446b;
      }
      bVar1 = ((byte *)ptr)[1];
      uVar8 = ((uint)bVar1 * 0x80 + (uint)(byte)*ptr) - 0x80;
      if (-1 < (char)bVar1) {
        uVar7 = (ulong)uVar8;
        pbVar4 = (byte *)ptr + 2;
        goto LAB_001744fb;
      }
      pVar11 = internal::VarintParseSlow64(ptr,uVar8);
      ptr = pVar11.first;
      this->deprecated_ = pVar11.second != 0;
      uVar8 = 1;
    }
    if ((byte *)ptr == (byte *)0x0) {
LAB_0017466b:
      ptr = (char *)0x0;
LAB_00174658:
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar8;
      return ptr;
    }
  } while( true );
}

Assistant:

const char* EnumValueOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional bool deprecated = 1 [default = false];
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}